

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O2

target_ulong_conflict
helper_extr_s_h_mips
          (target_ulong_conflict ac,target_ulong_conflict shift,CPUMIPSState_conflict *env)

{
  byte *pbVar1;
  long lVar2;
  long lVar3;
  
  lVar3 = CONCAT44((env->active_tc).HI[ac],(env->active_tc).LO[ac]) >> ((byte)shift & 0x1f);
  lVar2 = 0x7fff;
  if ((0x7fff < lVar3) || (lVar2 = 0xffff8000, lVar3 < -0x8000)) {
    lVar3 = lVar2;
    pbVar1 = (byte *)((long)&(env->active_tc).DSPControl + 2);
    *pbVar1 = *pbVar1 | 0x80;
  }
  return (target_ulong_conflict)lVar3;
}

Assistant:

target_ulong helper_extr_s_h(target_ulong ac, target_ulong shift,
                             CPUMIPSState *env)
{
    int64_t temp, acc;

    shift = shift & 0x1F;

    acc = ((int64_t)env->active_tc.HI[ac] << 32) |
          ((int64_t)env->active_tc.LO[ac] & 0xFFFFFFFF);

    temp = acc >> shift;

    if (temp > (int64_t)0x7FFF) {
        temp = 0x00007FFF;
        set_DSPControl_overflow_flag(1, 23, env);
    } else if (temp < (int64_t)0xFFFFFFFFFFFF8000ULL) {
        temp = 0xFFFF8000;
        set_DSPControl_overflow_flag(1, 23, env);
    }

    return (target_long)(int32_t)(temp & 0xFFFFFFFF);
}